

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

void Bac_NtkDfs_rec(Bac_Ntk_t *p,int iObj,Vec_Int_t *vBoxes)

{
  bool bVar1;
  int iVar2;
  int local_28;
  int local_24;
  int iFanin;
  int k;
  Vec_Int_t *vBoxes_local;
  int iObj_local;
  Bac_Ntk_t *p_local;
  
  iVar2 = Bac_ObjIsBo(p,iObj);
  if (iVar2 == 1) {
    iVar2 = Bac_ObjFanin(p,iObj);
    Bac_NtkDfs_rec(p,iVar2,vBoxes);
  }
  else {
    iVar2 = Bac_ObjIsPi(p,iObj);
    if ((iVar2 == 0) && (iVar2 = Bac_ObjIsBox(p,iObj), iVar2 == 0)) {
      __assert_fail("Bac_ObjIsPi(p, iObj) || Bac_ObjIsBox(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                    ,0x1c2,"void Bac_NtkDfs_rec(Bac_Ntk_t *, int, Vec_Int_t *)");
    }
    iVar2 = Bac_ObjCopy(p,iObj);
    if (iVar2 < 1) {
      Bac_ObjSetCopy(p,iObj,1);
      local_24 = 0;
      while( true ) {
        bVar1 = false;
        if (-1 < (iObj + -1) - local_24) {
          iVar2 = Bac_ObjIsBi(p,(iObj + -1) - local_24);
          bVar1 = false;
          if (iVar2 != 0) {
            local_28 = Bac_BoxFanin(p,iObj,local_24);
            bVar1 = true;
          }
        }
        if (!bVar1) break;
        Bac_NtkDfs_rec(p,local_28,vBoxes);
        local_24 = local_24 + 1;
      }
      Vec_IntPush(vBoxes,iObj);
    }
  }
  return;
}

Assistant:

void Bac_NtkDfs_rec( Bac_Ntk_t * p, int iObj, Vec_Int_t * vBoxes )
{
    int k, iFanin;
    if ( Bac_ObjIsBo(p, iObj) == 1 )
    {
        Bac_NtkDfs_rec( p, Bac_ObjFanin(p, iObj), vBoxes );
        return;
    }
    assert( Bac_ObjIsPi(p, iObj) || Bac_ObjIsBox(p, iObj) );
    if ( Bac_ObjCopy(p, iObj) > 0 ) // visited
        return;
    Bac_ObjSetCopy( p, iObj, 1 );
    Bac_BoxForEachFanin( p, iObj, iFanin, k )
        Bac_NtkDfs_rec( p, iFanin, vBoxes );
    Vec_IntPush( vBoxes, iObj );
}